

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_StateDescriptor.cpp
# Opt level: O1

vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> * __thiscall
amrex::StateDescriptor::sameInterps
          (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
           *__return_storage_ptr__,StateDescriptor *this,int a_scomp,int a_ncomp)

{
  pointer *pppVar1;
  iterator iVar2;
  pair<int,_int> pVar3;
  pair<int,_int> pVar4;
  InterpBase *pIVar5;
  int iVar6;
  InterpBase *pIVar7;
  long lVar8;
  pair<int,_int> local_30;
  
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_30.second = 1;
  if (1 < a_ncomp) {
    iVar6 = a_ncomp + a_scomp;
    pIVar5 = (this->mapper_comp).
             super_vector<amrex::InterpBase_*,_std::allocator<amrex::InterpBase_*>_>.
             super__Vector_base<amrex::InterpBase_*,_std::allocator<amrex::InterpBase_*>_>._M_impl.
             super__Vector_impl_data._M_start[a_scomp];
    if (pIVar5 == (InterpBase *)0x0) {
      pIVar5 = this->mapper;
    }
    lVar8 = (long)(a_scomp + 1);
    local_30.second = 1;
    do {
      pIVar7 = (this->mapper_comp).
               super_vector<amrex::InterpBase_*,_std::allocator<amrex::InterpBase_*>_>.
               super__Vector_base<amrex::InterpBase_*,_std::allocator<amrex::InterpBase_*>_>._M_impl
               .super__Vector_impl_data._M_start[lVar8];
      if (pIVar7 == (InterpBase *)0x0) {
        pIVar7 = this->mapper;
      }
      if (pIVar5 == pIVar7) {
        local_30.second = local_30.second + 1;
      }
      else {
        iVar2._M_current =
             (__return_storage_ptr__->
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl
             .super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          local_30.first = a_scomp;
          std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
          _M_realloc_insert<std::pair<int,int>>
                    ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                     __return_storage_ptr__,iVar2,&local_30);
        }
        else {
          pVar3.second = local_30.second;
          pVar3.first = a_scomp;
          *iVar2._M_current = pVar3;
          pppVar1 = &(__return_storage_ptr__->
                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)
                     ._M_impl.super__Vector_impl_data._M_finish;
          *pppVar1 = *pppVar1 + 1;
        }
        pIVar5 = (this->mapper_comp).
                 super_vector<amrex::InterpBase_*,_std::allocator<amrex::InterpBase_*>_>.
                 super__Vector_base<amrex::InterpBase_*,_std::allocator<amrex::InterpBase_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[lVar8];
        if (pIVar5 == (InterpBase *)0x0) {
          pIVar5 = this->mapper;
        }
        local_30.second = 1;
        a_scomp = (int)lVar8;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < iVar6);
  }
  iVar2._M_current =
       (__return_storage_ptr__->
       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (__return_storage_ptr__->
      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_30.first = a_scomp;
    std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
    _M_realloc_insert<std::pair<int,int>>
              ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
               __return_storage_ptr__,iVar2,&local_30);
  }
  else {
    pVar4.second = local_30.second;
    pVar4.first = a_scomp;
    *iVar2._M_current = pVar4;
    pppVar1 = &(__return_storage_ptr__->
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
               _M_impl.super__Vector_impl_data._M_finish;
    *pppVar1 = *pppVar1 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector< std::pair<int,int> >
StateDescriptor::sameInterps (int a_scomp,
                              int a_ncomp) const
{
    BL_ASSERT(a_scomp >= 0);
    BL_ASSERT(a_ncomp >= 1);

    std::vector< std::pair<int,int> > range;

    InterpBase* map = interp(a_scomp);

    int SComp = a_scomp, NComp = 1;

    for (int i = a_scomp+1; i < a_scomp+a_ncomp; i++)
    {
        if (map == interp(i))
        {
            NComp++;
        }
        else
        {
            range.push_back(std::pair<int,int>(SComp,NComp));

            map   = interp(i);
            SComp = i;
            NComp = 1;
        }
    }

    range.push_back(std::pair<int,int>(SComp,NComp));

#ifdef AMREX_DEBUG
    int sum = 0;
    for (int i = 0; i < static_cast<int>(range.size()); i++)
        sum += range[i].second;
    BL_ASSERT(sum == a_ncomp);
#endif

    return range;
}